

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O0

Aig_Man_t *
Aig_ManConstReduce(Aig_Man_t *p,int fUseMvSweep,int nFramesSymb,int nFramesSatur,int fVerbose,
                  int fVeryVerbose)

{
  int iVar1;
  Aig_Man_t *p_00;
  Vec_Ptr_t *local_38;
  Vec_Ptr_t *vMap;
  Aig_Man_t *pTemp;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nFramesSatur_local;
  int nFramesSymb_local;
  int fUseMvSweep_local;
  Aig_Man_t *p_local;
  
  _nFramesSymb_local = p;
  while( true ) {
    iVar1 = Aig_ManRegNum(_nFramesSymb_local);
    if (iVar1 < 1) {
      return _nFramesSymb_local;
    }
    if (fUseMvSweep == 0) {
      local_38 = Aig_ManTernarySimulate(_nFramesSymb_local,fVerbose,fVeryVerbose);
    }
    else {
      local_38 = Saig_MvManSimulate(_nFramesSymb_local,nFramesSymb,nFramesSatur,fVerbose,
                                    fVeryVerbose);
    }
    if (local_38 == (Vec_Ptr_t *)0x0) break;
    p_00 = Aig_ManRemap(_nFramesSymb_local,local_38);
    Vec_PtrFree(local_38);
    Aig_ManSeqCleanup(p_00);
    if (fVerbose != 0) {
      Aig_ManReportImprovement(_nFramesSymb_local,p_00);
    }
    Aig_ManStop(_nFramesSymb_local);
    _nFramesSymb_local = p_00;
  }
  return _nFramesSymb_local;
}

Assistant:

Aig_Man_t * Aig_ManConstReduce( Aig_Man_t * p, int fUseMvSweep, int nFramesSymb, int nFramesSatur, int fVerbose, int fVeryVerbose )
{
    Aig_Man_t * pTemp;
    Vec_Ptr_t * vMap;
    while ( Aig_ManRegNum(p) > 0 )
    {
        if ( fUseMvSweep )
            vMap = Saig_MvManSimulate( p, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
        else
            vMap = Aig_ManTernarySimulate( p, fVerbose, fVeryVerbose );
        if ( vMap == NULL )
            break;
        p = Aig_ManRemap( pTemp = p, vMap );
        Vec_PtrFree( vMap );
        Aig_ManSeqCleanup( p );
        if ( fVerbose )
            Aig_ManReportImprovement( pTemp, p );
        Aig_ManStop( pTemp );
    }
    return p;
}